

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LiteralExpressions.cpp
# Opt level: O0

void __thiscall
slang::ast::StringLiteral::StringLiteral
          (StringLiteral *this,Type *type,string_view value,string_view rawValue,
          ConstantValue *intVal,SourceRange sourceRange)

{
  SourceRange sourceRange_00;
  undefined8 in_RCX;
  undefined8 in_RDX;
  Expression *in_RSI;
  SourceLocation in_RDI;
  SourceLocation in_R8;
  undefined8 in_R9;
  undefined8 in_stack_00000008;
  Type *in_stack_00000010;
  
  sourceRange_00.endLoc = in_R8;
  sourceRange_00.startLoc = in_RDI;
  Expression::Expression
            (in_RSI,(ExpressionKind)((ulong)type >> 0x20),in_stack_00000010,sourceRange_00);
  *(undefined8 *)((long)in_RDI + 0x30) = in_RDX;
  *(undefined8 *)((long)in_RDI + 0x38) = in_RCX;
  *(SourceLocation *)((long)in_RDI + 0x40) = in_R8;
  *(undefined8 *)((long)in_RDI + 0x48) = in_R9;
  *(undefined8 *)((long)in_RDI + 0x50) = in_stack_00000008;
  return;
}

Assistant:

StringLiteral::StringLiteral(const Type& type, std::string_view value, std::string_view rawValue,
                             ConstantValue& intVal, SourceRange sourceRange) :
    Expression(ExpressionKind::StringLiteral, type, sourceRange), value(value), rawValue(rawValue),
    intStorage(&intVal) {
}